

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O0

HCOSE_SIGNER COSE_Sign_GetSigner(HCOSE_SIGN cose,int iSigner,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_SIGN local_38;
  COSE_SignerInfo *p;
  int i;
  cose_errback *perr_local;
  int iSigner_local;
  HCOSE_SIGN cose_local;
  
  _Var1 = IsValidSignHandle(cose);
  if (_Var1) {
    local_38 = *(HCOSE_SIGN *)(cose + 0x58);
    for (p._4_4_ = 0; p._4_4_ < iSigner; p._4_4_ = p._4_4_ + 1) {
      if (local_38 == (HCOSE_SIGN)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
        return (HCOSE_SIGNER)0x0;
      }
      local_38 = *(HCOSE_SIGN *)(local_38 + 0x60);
    }
    *(int *)(local_38 + 0x10) = *(int *)(local_38 + 0x10) + 1;
    cose_local = local_38;
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
    cose_local = (HCOSE_SIGN)0x0;
  }
  return (HCOSE_SIGNER)cose_local;
}

Assistant:

HCOSE_SIGNER COSE_Sign_GetSigner(HCOSE_SIGN cose, int iSigner, cose_errback * perr)
{
	int i;
	COSE_SignerInfo * p;

	if (!IsValidSignHandle(cose)) {
		if (perr != NULL) perr->err = COSE_ERR_INVALID_HANDLE;
		return NULL;
	}

	p = ((COSE_SignMessage *)cose)->m_signerFirst;
	for (i = 0; i < iSigner; i++) {
		if (p == NULL) {
			if (perr != NULL) perr->err = COSE_ERR_INVALID_PARAMETER;
			return NULL;
		}
		p = p->m_signerNext;
	}
	p->m_message.m_refCount++;

	return (HCOSE_SIGNER)p;
}